

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void test_ht_3(void)

{
  int iVar1;
  spki_record *record;
  spki_record *record_00;
  spki_record *record_01;
  spki_record *record_02;
  long in_FS_OFFSET;
  spki_record *record4;
  spki_record *record3;
  spki_record *record2;
  spki_record *record1;
  spki_record *psStack_188;
  uint result_len;
  spki_record *result;
  spki_table table;
  
  table.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  record = create_record(10,10,10,(rtr_socket *)0x0);
  record_00 = create_record(10,10,0xb,(rtr_socket *)0x0);
  record_01 = create_record(10,0xb,10,(rtr_socket *)0x0);
  record_02 = create_record(0xb,10,10,(rtr_socket *)0x0);
  spki_table_init((spki_table *)&result,(spki_update_fp)0x0);
  _spki_table_add_assert((spki_table *)&result,record);
  _spki_table_add_assert((spki_table *)&result,record_00);
  _spki_table_add_assert((spki_table *)&result,record_01);
  _spki_table_add_assert((spki_table *)&result,record_02);
  _spki_table_remove_assert((spki_table *)&result,record);
  iVar1 = spki_table_get_all((spki_table *)&result,record_00->asn,record_00->ski,
                             &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
  if (iVar1 != 0) {
    __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xf8,"void test_ht_3(void)");
  }
  if (record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xf9,"void test_ht_3(void)");
  }
  free(psStack_188);
  iVar1 = spki_table_get_all((spki_table *)&result,record_01->asn,record_01->ski,
                             &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
  if (iVar1 != 0) {
    __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xfc,"void test_ht_3(void)");
  }
  if (record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0xfd,"void test_ht_3(void)");
  }
  free(psStack_188);
  iVar1 = spki_table_get_all((spki_table *)&result,record_02->asn,record_02->ski,
                             &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
  if (iVar1 != 0) {
    __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x100,"void test_ht_3(void)");
  }
  if (record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x101,"void test_ht_3(void)");
  }
  free(psStack_188);
  _spki_table_add_assert((spki_table *)&result,record);
  _spki_table_remove_assert((spki_table *)&result,record_00);
  iVar1 = spki_table_get_all((spki_table *)&result,record->asn,record->ski,&stack0xfffffffffffffe78,
                             (uint *)((long)&record1 + 4));
  if (iVar1 != 0) {
    __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x109,"void test_ht_3(void)");
  }
  if (record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x10a,"void test_ht_3(void)");
  }
  free(psStack_188);
  iVar1 = spki_table_get_all((spki_table *)&result,record_01->asn,record_01->ski,
                             &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
  if (iVar1 != 0) {
    __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x10d,"void test_ht_3(void)");
  }
  if (record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x10e,"void test_ht_3(void)");
  }
  free(psStack_188);
  iVar1 = spki_table_get_all((spki_table *)&result,record_02->asn,record_02->ski,
                             &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
  if (iVar1 != 0) {
    __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x111,"void test_ht_3(void)");
  }
  if (record1._4_4_ != 1) {
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x112,"void test_ht_3(void)");
  }
  free(psStack_188);
  _spki_table_add_assert((spki_table *)&result,record_00);
  _spki_table_remove_assert((spki_table *)&result,record_01);
  iVar1 = spki_table_get_all((spki_table *)&result,record->asn,record->ski,&stack0xfffffffffffffe78,
                             (uint *)((long)&record1 + 4));
  if (iVar1 != 0) {
    __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x11a,"void test_ht_3(void)");
  }
  if (record1._4_4_ != 2) {
    __assert_fail("result_len == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x11b,"void test_ht_3(void)");
  }
  free(psStack_188);
  iVar1 = spki_table_get_all((spki_table *)&result,record_00->asn,record_00->ski,
                             &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
  if (iVar1 != 0) {
    __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x11e,"void test_ht_3(void)");
  }
  if (record1._4_4_ == 2) {
    free(psStack_188);
    iVar1 = spki_table_get_all((spki_table *)&result,record_02->asn,record_02->ski,
                               &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
    if (iVar1 != 0) {
      __assert_fail("spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x122,"void test_ht_3(void)");
    }
    if (record1._4_4_ != 1) {
      __assert_fail("result_len == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x123,"void test_ht_3(void)");
    }
    free(psStack_188);
    _spki_table_add_assert((spki_table *)&result,record_01);
    _spki_table_remove_assert((spki_table *)&result,record_02);
    iVar1 = spki_table_get_all((spki_table *)&result,record->asn,record->ski,
                               &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
    if (iVar1 != 0) {
      __assert_fail("spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,299,"void test_ht_3(void)");
    }
    if (record1._4_4_ != 2) {
      __assert_fail("result_len == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,300,"void test_ht_3(void)");
    }
    free(psStack_188);
    iVar1 = spki_table_get_all((spki_table *)&result,record_00->asn,record_00->ski,
                               &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
    if (iVar1 != 0) {
      __assert_fail("spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x12f,"void test_ht_3(void)");
    }
    if (record1._4_4_ != 2) {
      __assert_fail("result_len == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x130,"void test_ht_3(void)");
    }
    free(psStack_188);
    iVar1 = spki_table_get_all((spki_table *)&result,record_01->asn,record_01->ski,
                               &stack0xfffffffffffffe78,(uint *)((long)&record1 + 4));
    if (iVar1 != 0) {
      __assert_fail("spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x133,"void test_ht_3(void)");
    }
    if (record1._4_4_ == 1) {
      free(psStack_188);
      spki_table_free((spki_table *)&result);
      free(record);
      free(record_00);
      free(record_01);
      free(record_02);
      printf("%s complete\n","test_ht_3");
      if (*(long *)(in_FS_OFFSET + 0x28) == table.lock._48_8_) {
        return;
      }
      __stack_chk_fail();
    }
    __assert_fail("result_len == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x134,"void test_ht_3(void)");
  }
  __assert_fail("result_len == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                ,0x11f,"void test_ht_3(void)");
}

Assistant:

static void test_ht_3(void)
{
	struct spki_table table;
	struct spki_record *result;
	unsigned int result_len;

	/* create 4 distinct SPKI records, (at least) one parameter different */
	struct spki_record *record1 = create_record(10, 10, 10, NULL);
	struct spki_record *record2 = create_record(10, 10, 11, NULL);
	struct spki_record *record3 = create_record(10, 11, 10, NULL);
	struct spki_record *record4 = create_record(11, 10, 10, NULL);

	/* TEST0:init table and add records -> checks compare function */
	spki_table_init(&table, NULL);
	_spki_table_add_assert(&table, record1);
	_spki_table_add_assert(&table, record2);
	_spki_table_add_assert(&table, record3);
	_spki_table_add_assert(&table, record4);

	/* TEST1: remove record1, check others -------------------------------*/
	_spki_table_remove_assert(&table, record1);
	/* Check if other records are still there */
	assert(spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);

	assert(spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);

	assert(spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);
	/* (re)add record1 */
	_spki_table_add_assert(&table, record1);

	/* TEST2: remove record2, check others -------------------------------*/
	_spki_table_remove_assert(&table, record2);
	/* Check if other records are still there */
	assert(spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);

	assert(spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);

	assert(spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);
	/* (re)add record2 */
	_spki_table_add_assert(&table, record2);

	/* TEST3: remove record3, check others -------------------------------*/
	_spki_table_remove_assert(&table, record3);
	/* Check if other records are still there */
	assert(spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 2);
	free(result);

	assert(spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 2);
	free(result);

	assert(spki_table_get_all(&table, record4->asn, record4->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);
	/* (re)add record3 */
	_spki_table_add_assert(&table, record3);

	/* TEST4: remove record4, check others -------------------------------*/
	_spki_table_remove_assert(&table, record4);
	/* Check if other records are still there */
	assert(spki_table_get_all(&table, record1->asn, record1->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 2);
	free(result);

	assert(spki_table_get_all(&table, record2->asn, record2->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 2);
	free(result);

	assert(spki_table_get_all(&table, record3->asn, record3->ski, &result, &result_len) == SPKI_SUCCESS);
	assert(result_len == 1);
	free(result);

	/* cleanup: free memory */
	spki_table_free(&table);
	free(record1);
	free(record2);
	free(record3);
	free(record4);
	printf("%s complete\n", __func__);
}